

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O2

void __thiscall
DivideTest<unsigned_long>::test_pow2_numerators<(libdivide::Branching)0>
          (DivideTest<unsigned_long> *this,unsigned_long denom,
          divider<unsigned_long,_(libdivide::Branching)0> *the_divider)

{
  int i;
  ulong uVar1;
  int j;
  long lVar2;
  
  for (uVar1 = 1; uVar1 != 0x40; uVar1 = uVar1 + 1) {
    for (lVar2 = -1; lVar2 != 2; lVar2 = lVar2 + 1) {
      test_one<(libdivide::Branching)0>(this,(1L << (uVar1 & 0x3f)) + lVar2,denom,the_divider);
    }
  }
  return;
}

Assistant:

void test_pow2_numerators(T denom, const divider<T, ALGO> &the_divider) {
        // test power of 2 numerators: 2^i-1, 2^i, 2^i+1
        for (int i = 1; i < limits::digits; i++) {
            for (int j = -1; j <= 1; j++) {
                T numerator = static_cast<T>((static_cast<T>(1) << i) + j);
                test_one(numerator, denom, the_divider);

                if (limits::is_signed) {
                    test_one(-numerator, denom, the_divider);
                }
            }
        }
    }